

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_test.cc
# Opt level: O2

void re2::RegexpSearchTests(void)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  StringPiece SStack_1b8;
  LogMessageFatal local_1a8;
  
  iVar2 = 0;
  for (lVar3 = 8; lVar3 != 0xea8; lVar3 = lVar3 + 0x10) {
    StringPiece::StringPiece((StringPiece *)&local_1a8,*(char **)((long)&__dso_handle + lVar3));
    StringPiece::StringPiece(&SStack_1b8,*(char **)((long)&simple_tests + lVar3));
    bVar1 = TestRegexpOnText((StringPiece *)&local_1a8,&SStack_1b8);
    iVar2 = iVar2 + (uint)!bVar1;
  }
  if (iVar2 != 0) {
    LogMessageFatal::LogMessageFatal
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/search_test.cc"
               ,0x147);
    std::operator<<((ostream *)&local_1a8.super_LogMessage.str_,"Check failed: (failures) == (0)");
    LogMessageFatal::~LogMessageFatal(&local_1a8);
  }
  return;
}

Assistant:

TEST(Regexp, SearchTests) {
  int failures = 0;
  for (int i = 0; i < arraysize(simple_tests); i++) {
    const RegexpTest& t = simple_tests[i];
    if (!TestRegexpOnText(t.regexp, t.text))
      failures++;

#ifdef LOGGING
    // Build a dummy ExhaustiveTest call that will trigger just
    // this one test, so that we log the test case.
    vector<string> atom, alpha, ops;
    atom.push_back(StringPiece(t.regexp).as_string());
    alpha.push_back(StringPiece(t.text).as_string());
    ExhaustiveTest(1, 0, atom, ops, 1, alpha, "", "");
#endif

  }
  EXPECT_EQ(failures, 0);
}